

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdNtkFree(Kit_DsdNtk_t *pNtk)

{
  bool bVar1;
  uint local_1c;
  Kit_DsdObj_t *pKStack_18;
  uint i;
  Kit_DsdObj_t *pObj;
  Kit_DsdNtk_t *pNtk_local;
  
  local_1c = 0;
  while( true ) {
    bVar1 = false;
    if (local_1c < pNtk->nNodes) {
      pKStack_18 = pNtk->pNodes[local_1c];
      bVar1 = pKStack_18 != (Kit_DsdObj_t *)0x0;
    }
    if (!bVar1) break;
    if (pKStack_18 != (Kit_DsdObj_t *)0x0) {
      free(pKStack_18);
      pKStack_18 = (Kit_DsdObj_t *)0x0;
    }
    local_1c = local_1c + 1;
  }
  if (pNtk->pSupps != (uint *)0x0) {
    free(pNtk->pSupps);
    pNtk->pSupps = (uint *)0x0;
  }
  if (pNtk->pNodes != (Kit_DsdObj_t **)0x0) {
    free(pNtk->pNodes);
    pNtk->pNodes = (Kit_DsdObj_t **)0x0;
  }
  if (pNtk->pMem != (uint *)0x0) {
    free(pNtk->pMem);
    pNtk->pMem = (uint *)0x0;
  }
  if (pNtk != (Kit_DsdNtk_t *)0x0) {
    free(pNtk);
  }
  return;
}

Assistant:

void Kit_DsdNtkFree( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj;
    unsigned i;
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
        ABC_FREE( pObj );
    ABC_FREE( pNtk->pSupps );
    ABC_FREE( pNtk->pNodes );
    ABC_FREE( pNtk->pMem );
    ABC_FREE( pNtk );
}